

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer_utils.cc
# Opt level: O0

void draco::SplitPathPrivate(string *full_path,string *out_folder_path,string *out_file_name)

{
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  size_type pos;
  string local_60 [32];
  string local_40 [32];
  long local_20;
  string *local_18;
  string *local_10;
  string *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = std::__cxx11::string::find_last_of((char *)in_RDI,0x2112a4);
  if (local_20 == -1) {
    if (local_10 != (string *)0x0) {
      std::__cxx11::string::operator=(local_10,".");
    }
    if (local_18 != (string *)0x0) {
      std::__cxx11::string::operator=(local_18,local_8);
    }
  }
  else {
    if (local_10 != (string *)0x0) {
      std::__cxx11::string::substr((ulong)local_40,(ulong)local_8);
      std::__cxx11::string::operator=(local_10,local_40);
      std::__cxx11::string::~string(local_40);
    }
    if (local_18 != (string *)0x0) {
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)local_60,(ulong)local_8);
      std::__cxx11::string::operator=(local_18,local_60);
      std::__cxx11::string::~string(local_60);
    }
  }
  return;
}

Assistant:

void SplitPathPrivate(const std::string &full_path,
                      std::string *out_folder_path,
                      std::string *out_file_name) {
  const auto pos = full_path.find_last_of("/\\");
  if (pos != std::string::npos) {
    if (out_folder_path) {
      *out_folder_path = full_path.substr(0, pos);
    }
    if (out_file_name) {
      *out_file_name = full_path.substr(pos + 1, full_path.length());
    }
  } else {
    if (out_folder_path) {
      *out_folder_path = ".";
    }
    if (out_file_name) {
      *out_file_name = full_path;
    }
  }
}